

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
union_vertices(Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               *this,Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                     *a)

{
  size_type sVar1;
  size_type sVar2;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  back_insert_iterator<std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
  __result;
  iterator __first;
  iterator __last;
  undefined1 local_30 [8];
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  v;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *a_local;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *this_local;
  
  v.
  super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)a;
  std::
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::vector((vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
            *)local_30);
  sVar1 = std::
          set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
          ::size(&this->simplex_set);
  sVar2 = std::
          set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
          ::size((set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                  *)v.
                    super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::reserve((vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
             *)local_30,sVar1 + sVar2);
  __first1 = std::
             set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
             ::begin(&this->simplex_set);
  __last1 = std::
            set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
            ::end(&this->simplex_set);
  __first2 = std::
             set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
             ::begin((set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                      *)v.
                        super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __last2 = std::
            set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
            ::end((set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                   *)v.
                     super__Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __result = std::
             back_inserter<std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>
                       ((vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                         *)local_30);
  std::
  set_union<std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::back_insert_iterator<std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>>
            ((_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              )__first1._M_node,
             (_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              )__last1._M_node,
             (_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              )__first2._M_node,
             (_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              )__last2._M_node,__result);
  clear(this);
  __first = std::
            vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
            ::begin((vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                     *)local_30);
  __last = std::
           vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
           ::end((vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                  *)local_30);
  std::
  set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
  ::
  insert<__gnu_cxx::__normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle*,std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>>
            ((set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
              *)this,(__normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_*,_std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                      )__first._M_current,
             (__normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_*,_std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
              )__last._M_current);
  std::
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~vector((vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
             *)local_30);
  return;
}

Assistant:

void union_vertices(const Skeleton_blocker_simplex & a) {
    std::vector<T> v;
    v.reserve(simplex_set.size() + a.simplex_set.size());

    set_union(simplex_set.begin(), simplex_set.end(), a.simplex_set.begin(),
              a.simplex_set.end(), std::back_inserter(v));
    clear();
    simplex_set.insert(v.begin(), v.end());
  }